

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsubcmesh.cpp
# Opt level: O1

void __thiscall TPZSubCompMesh::Read(TPZSubCompMesh *this)

{
  void *in_RDX;
  TPZStream *in_RSI;
  
  Read((TPZSubCompMesh *)
       &this[-1].super_TPZCompMesh.fConnectVec.super_TPZChunkVector<TPZConnect,_10>.fNElements,
       in_RSI,in_RDX);
  return;
}

Assistant:

void TPZSubCompMesh::Read(TPZStream &buf, void *context)
{
	TPZCompEl::Read(buf,context);
	TPZCompMesh::Read(buf,Mesh()->Reference());
    TPZCompMesh *mesh = (TPZCompMesh *) context;
    TPZManVector<int> matindex;
    buf.Read( matindex);
    int sz = matindex.size();
    for (int im=0; im<sz; im++) {
        MaterialVec()[matindex[im]] = mesh->MaterialVec()[matindex[im]];
    }
	buf.Read(fConnectIndex);
	buf.Read(fExternalLocIndex);
	buf.Read( fFatherToLocal);
    buf.Read(&fSingularConnect,1);
}